

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O0

char * strncat(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  bool bVar2;
  char *rc;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  for (s2_local = __dest; rc = (char *)__n, n_local = (size_t)__src, *s2_local != '\0';
      s2_local = s2_local + 1) {
  }
  while( true ) {
    bVar2 = false;
    if (rc != (char *)0x0) {
      cVar1 = *(char *)n_local;
      *s2_local = cVar1;
      bVar2 = cVar1 != '\0';
      n_local = n_local + 1;
      s2_local = s2_local + 1;
    }
    if (!bVar2) break;
    rc = rc + -1;
  }
  if (rc == (char *)0x0) {
    *s2_local = '\0';
  }
  return __dest;
}

Assistant:

char * strncat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( *s1 )
    {
        ++s1;
    }

    while ( n && ( *s1++ = *s2++ ) )
    {
        --n;
    }

    if ( n == 0 )
    {
        *s1 = '\0';
    }

    return rc;
}